

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<double,unsigned_long>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,double *t_lhs,double *c_lhs,
          unsigned_long *c_rhs)

{
  unsigned_long uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  arithmetic_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  Boxed_Value BVar11;
  string local_48;
  
  switch(t_oper) {
  case equals:
    bVar5 = ((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0) == *c_lhs;
    break;
  case less_than:
    dVar10 = ((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0);
    bVar5 = dVar10 == *c_lhs;
    bVar6 = dVar10 < *c_lhs;
    goto LAB_002f1c99;
  case greater_than:
    auVar7._0_8_ = (double)CONCAT44(0x43300000,(int)*c_rhs);
    auVar7._8_4_ = (int)(*c_rhs >> 0x20);
    auVar7._12_4_ = 0x45300000;
    dVar10 = (auVar7._8_8_ - 1.9342813113834067e+25) + (auVar7._0_8_ - 4503599627370496.0);
    bVar5 = *c_lhs == dVar10;
    bVar6 = *c_lhs < dVar10;
LAB_002f1c99:
    bVar5 = !bVar6 && !bVar5;
    goto LAB_002f1d1c;
  case less_than_equal:
    bVar5 = ((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0) < *c_lhs;
    goto LAB_002f1c3f;
  case greater_than_equal:
    bVar5 = *c_lhs < ((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0);
LAB_002f1c3f:
    bVar5 = !bVar5;
    goto LAB_002f1d1c;
  case not_equal:
    bVar5 = ((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0) != *c_lhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_48._M_dataplus._M_p =
           (pointer)(((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0) + *c_lhs);
      break;
    case quotient:
      uVar1 = *c_rhs;
      if (uVar1 == 0) {
        this_00 = (arithmetic_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
        local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
        local_48.field_2._8_6_ = 0x6f72657a2079;
        local_48._M_string_length = 0xe;
        local_48.field_2._M_local_buf[0xe] = '\0';
        exception::arithmetic_error::arithmetic_error(this_00,&local_48);
        __cxa_throw(this_00,&exception::arithmetic_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      auVar9._8_4_ = (int)(uVar1 >> 0x20);
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      local_48._M_dataplus._M_p =
           (pointer)(*c_lhs / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
      break;
    case product:
      local_48._M_dataplus._M_p =
           (pointer)((((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25)
                     + ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0)) * *c_lhs);
      break;
    case difference:
      auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)*c_rhs);
      auVar8._8_4_ = (int)(*c_rhs >> 0x20);
      auVar8._12_4_ = 0x45300000;
      local_48._M_dataplus._M_p =
           (pointer)(*c_lhs - ((auVar8._8_8_ - 1.9342813113834067e+25) +
                              (auVar8._0_8_ - 4503599627370496.0)));
      break;
    default:
      if (t_lhs == (double *)0x0) {
switchD_002f1b8c_caseD_7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__bad_cast_003c7d48;
        __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
      switch(t_oper) {
      case assign:
        dVar10 = ((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0);
        break;
      default:
        goto switchD_002f1b8c_caseD_7;
      case assign_product:
        dVar10 = (((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0)) * *t_lhs;
        break;
      case assign_sum:
        dVar10 = ((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0) + *t_lhs;
        break;
      case assign_quotient:
        check_divide_by_zero<unsigned_long>(*c_rhs);
        dVar10 = *t_lhs / (((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0));
        _Var4._M_pi = extraout_RDX;
        goto LAB_002f1db8;
      case assign_difference:
        dVar10 = *t_lhs - (((double)CONCAT44(0x45300000,(int)(*c_rhs >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)*c_rhs) - 4503599627370496.0));
LAB_002f1db8:
        *t_lhs = dVar10;
        goto LAB_002f1dea;
      }
      *t_lhs = dVar10;
LAB_002f1dea:
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      goto LAB_002f1d21;
    }
    BVar11 = detail::const_var_impl<double>((detail *)this,(double *)&local_48);
    _Var4._M_pi = BVar11.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_002f1d21;
  }
  bVar5 = (bool)(-bVar5 & 1);
LAB_002f1d1c:
  BVar11 = const_var((chaiscript *)this,bVar5);
  _Var4._M_pi = BVar11.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_002f1d21:
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }